

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::ParseEnumDefinition
          (Parser *this,EnumDescriptorProto *enum_type,LocationRecorder *enum_location,
          FileDescriptorProto *containing_file)

{
  bool bVar1;
  string *output;
  string_view text;
  LocationRecorder location;
  
  text._M_str = "enum";
  text._M_len = 4;
  bVar1 = Consume(this,text);
  if (bVar1) {
    LocationRecorder::LocationRecorder(&location,enum_location,1);
    LocationRecorder::RecordLegacyLocation(&location,&enum_type->super_Message,NAME);
    output = EnumDescriptorProto::_internal_mutable_name_abi_cxx11_(enum_type);
    bVar1 = ConsumeIdentifier(this,output,(ErrorMaker)ZEXT816(0x2fba07));
    LocationRecorder::~LocationRecorder(&location);
    if ((bVar1) && (bVar1 = ParseEnumBlock(this,enum_type,enum_location,containing_file), bVar1)) {
      bVar1 = ValidateEnum(this,enum_type);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool Parser::ParseEnumDefinition(EnumDescriptorProto* enum_type,
                                 const LocationRecorder& enum_location,
                                 const FileDescriptorProto* containing_file) {
  DO(Consume("enum"));

  {
    LocationRecorder location(enum_location,
                              EnumDescriptorProto::kNameFieldNumber);
    location.RecordLegacyLocation(enum_type,
                                  DescriptorPool::ErrorCollector::NAME);
    DO(ConsumeIdentifier(enum_type->mutable_name(), "Expected enum name."));
  }

  DO(ParseEnumBlock(enum_type, enum_location, containing_file));

  DO(ValidateEnum(enum_type));

  return true;
}